

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  byte in_CL;
  undefined4 in_EDX;
  undefined8 in_RSI;
  SizeType length_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *ret
  ;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *ret_1;
  size_t in_stack_ffffffffffffff48;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Stack<rapidjson::CrtAllocator> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff60;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  length_00 = (SizeType)((ulong)in_RSI >> 0x20);
  if ((in_CL & 1) == 0) {
    if ((long)(in_RDI->stack_).stackEnd_ - (long)(in_RDI->stack_).stackTop_ < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    (in_RDI->stack_).stackTop_ = (in_RDI->stack_).stackTop_ + 0x10;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_ffffffffffffff60,
                 (Ch *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (SizeType)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  }
  else {
    this_00 = &in_RDI->stack_;
    if ((long)(in_RDI->stack_).stackEnd_ - (long)(in_RDI->stack_).stackTop_ < 0x10) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)this_00->stackTop_;
    this_00->stackTop_ = this_00->stackTop_ + 0x10;
    GetAllocator(in_RDI);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this_00,(Ch *)CONCAT44(in_EDX,in_stack_ffffffffffffff58),length_00,allocator);
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) { 
        if (copy) 
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }